

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_op_mode_t MIR_insn_op_mode(MIR_context_t ctx,MIR_insn_t_conflict insn,size_t nop,int *out_p)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  size_t local_e0;
  bool local_c9;
  MIR_op_mode_t local_bc;
  MIR_op_mode_t local_b8;
  MIR_var_t local_b0;
  ulong local_98;
  size_t args_start;
  MIR_proto_t proto;
  MIR_op_t proto_op;
  uint mode;
  size_t nops;
  size_t nargs;
  MIR_insn_code_t code;
  int *out_p_local;
  size_t nop_local;
  MIR_insn_t_conflict insn_local;
  MIR_context_t ctx_local;
  
  uVar6 = *(ulong *)&insn->field_0x18;
  iVar2 = (int)uVar6;
  sVar3 = MIR_insn_nops(ctx,insn);
  *out_p = 0;
  if (nop < sVar3) {
    if (out_p == (int *)0x0) {
      __assert_fail("out_p != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x82d,
                    "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
    }
    if (iVar2 - 0x1eU < 4) {
      *out_p = (uint)(nop == 0);
      if (nop == 0) {
        local_bc = MIR_OP_INT;
      }
      else {
        local_bc = (MIR_op_mode_t)(*(ushort *)&insn->ops[nop].field_0x8 & 0xff);
      }
      ctx_local._4_4_ = local_bc;
    }
    else {
      if (1 < iVar2 - 0xa7U) {
        if (iVar2 - 0xaaU < 2) {
          if ((nop == 0) && (iVar2 != 0xab)) {
            local_b8 = MIR_OP_INT;
          }
          else {
            local_b8 = (MIR_op_mode_t)(*(ushort *)&insn->ops[nop].field_0x8 & 0xff);
          }
          return local_b8;
        }
        if (iVar2 != 0xb5) {
          if (iVar2 == 0xb9) {
            return (uint)(*(ushort *)&insn->ops[nop].field_0x8 & 0xff);
          }
          if (iVar2 != 0xba) {
            bVar1 = *(byte *)((uVar6 & 0xffffffff) * 0x18 + 0x1f0ab0 + nop);
            if ((bVar1 & 0x80) == 0) {
              return (uint)bVar1;
            }
            *out_p = 1;
            return bVar1 ^ 0x80;
          }
          *out_p = (uint)(nop == 0);
          return (uint)(*(ushort *)&insn->ops[nop].field_0x8 & 0xff);
        }
      }
      if (iVar2 == 0xb5) {
        local_98 = 1;
        if ((*(ushort *)&insn->ops[0].field_0x8 & 0xff) != 3) {
          __assert_fail("insn->ops[0].mode == MIR_OP_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x842,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        uVar6 = insn->ops[0].u.u;
        sVar4 = VARR_MIR_proto_tlength(ctx->unspec_protos);
        if (sVar4 <= uVar6) {
          __assert_fail("insn->ops[0].u.u < (VARR_MIR_proto_tlength (ctx->unspec_protos))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x843,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        args_start = (size_t)VARR_MIR_proto_tget(ctx->unspec_protos,insn->ops[0].u.str.len);
      }
      else {
        local_98 = 2;
        memcpy(&proto,insn->ops,0x30);
        if ((((ushort)proto_op.data & 0xff) != 8) || (*(int *)(proto_op._8_8_ + 0x20) != 1)) {
          __assert_fail("proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x848,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        args_start = *(size_t *)(proto_op._8_8_ + 0x40);
      }
      local_c9 = false;
      if (local_98 <= nop) {
        local_c9 = nop < *(uint *)(args_start + 8) + local_98;
      }
      *out_p = (uint)local_c9;
      lVar5 = *(uint *)(args_start + 8) + local_98;
      if (*(long *)(args_start + 0x20) == 0) {
        local_e0 = 0;
      }
      else {
        local_e0 = VARR_MIR_var_tlength(*(VARR_MIR_var_t **)(args_start + 0x20));
      }
      uVar6 = lVar5 + local_e0;
      if ((*(char *)(args_start + 0x18) == '\0') || (nop < uVar6)) {
        if ((sVar3 < uVar6) || ((*(char *)(args_start + 0x18) == '\0' && (sVar3 != uVar6)))) {
          __assert_fail("nops >= nargs && (proto->vararg_p || nops == nargs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x84f,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        if (nop == 0) {
          ctx_local._4_4_ = (MIR_op_mode_t)(*(ushort *)&insn->ops[0].field_0x8 & 0xff);
        }
        else if ((nop == 1) && (iVar2 != 0xb5)) {
          ctx_local._4_4_ = MIR_OP_INT;
        }
        else if ((nop < local_98) || (*(uint *)(args_start + 8) + local_98 <= nop)) {
          VARR_MIR_var_tget(&local_b0,*(VARR_MIR_var_t **)(args_start + 0x20),
                            (nop - local_98) - (ulong)*(uint *)(args_start + 8));
          ctx_local._4_4_ = type2mode(local_b0.type);
        }
        else {
          ctx_local._4_4_ =
               type2mode(*(MIR_type_t *)(*(long *)(args_start + 0x10) + (nop - local_98) * 4));
        }
      }
      else {
        ctx_local._4_4_ = MIR_OP_UNDEF;
      }
    }
  }
  else {
    ctx_local._4_4_ = MIR_OP_BOUND;
  }
  return ctx_local._4_4_;
}

Assistant:

MIR_op_mode_t MIR_insn_op_mode (MIR_context_t ctx, MIR_insn_t insn, size_t nop, int *out_p) {
  MIR_insn_code_t code = insn->code;
  size_t nargs, nops = MIR_insn_nops (ctx, insn);
  unsigned mode;

  *out_p = FALSE; /* to remove unitialized warning */
  if (nop >= nops) return MIR_OP_BOUND;
  mir_assert (out_p != NULL);
  switch (code) {
  case MIR_RET:
  case MIR_SWITCH:
    /* should be already checked in MIR_finish_func */
    return nop == 0 && code != MIR_RET ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_ADDR:
  case MIR_ADDR8:
  case MIR_ADDR16:
  case MIR_ADDR32: *out_p = nop == 0; return nop == 0 ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_PHI: *out_p = nop == 0; return insn->ops[nop].mode;
  case MIR_USE: return insn->ops[nop].mode;
  case MIR_CALL:
  case MIR_INLINE:
  case MIR_UNSPEC: {
    MIR_op_t proto_op;
    MIR_proto_t proto;
    size_t args_start;

    if (code == MIR_UNSPEC) {
      args_start = 1;
      mir_assert (insn->ops[0].mode == MIR_OP_INT);
      mir_assert (insn->ops[0].u.u < VARR_LENGTH (MIR_proto_t, unspec_protos));
      proto = VARR_GET (MIR_proto_t, unspec_protos, insn->ops[0].u.u);
    } else {
      args_start = 2;
      proto_op = insn->ops[0];
      mir_assert (proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item);
      proto = proto_op.u.ref->u.proto;
    }
    *out_p = args_start <= nop && nop < proto->nres + args_start;
    nargs
      = proto->nres + args_start + (proto->args == NULL ? 0 : VARR_LENGTH (MIR_var_t, proto->args));
    if (proto->vararg_p && nop >= nargs) return MIR_OP_UNDEF; /* unknown */
    mir_assert (nops >= nargs && (proto->vararg_p || nops == nargs));
    if (nop == 0) return insn->ops[nop].mode;
    if (nop == 1 && code != MIR_UNSPEC) return MIR_OP_INT; /* call func addr */
    if (args_start <= nop && nop < proto->nres + args_start)
      return type2mode (proto->res_types[nop - args_start]);
    return type2mode (VARR_GET (MIR_var_t, proto->args, nop - args_start - proto->nres).type);
  }
  default:
    mode = insn_descs[code].op_modes[nop];
    if ((mode & OUT_FLAG) == 0) return mode;
    *out_p = TRUE;
    return mode ^ OUT_FLAG;
  }
}